

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O3

bool __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,boolean_option_type opt,error_code *e)

{
  error_category *peVar1;
  native_type __fd;
  int iVar2;
  int *piVar3;
  int __level;
  int value;
  socklen_t len;
  int local_10 [2];
  
  local_10[0] = 0;
  local_10[1] = 4;
  if (opt == reuse_address) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 1;
    iVar2 = 2;
  }
  else if (opt == keep_alive) {
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 1;
    iVar2 = 9;
  }
  else {
    if (opt != tcp_no_delay) {
      return false;
    }
    __fd = basic_io_device::native(&this->super_basic_io_device);
    __level = 6;
    iVar2 = 1;
  }
  iVar2 = getsockopt(__fd,__level,iVar2,local_10,(socklen_t *)(local_10 + 1));
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    peVar1 = syscat;
    e->_M_value = *piVar3;
    e->_M_cat = peVar1;
    return false;
  }
  return local_10[0] != 0;
}

Assistant:

bool basic_socket::get_option(boolean_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case tcp_no_delay:
		res=::getsockopt(native(),IPPROTO_TCP,TCP_NODELAY,ptr,&len);
		break;
	case keep_alive:
		res=::getsockopt(native(),SOL_SOCKET,SO_KEEPALIVE,ptr,&len);
		break;
	case reuse_address:
		res=::getsockopt(native(),SOL_SOCKET,SO_REUSEADDR,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value!=0;
}